

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O1

void __thiscall aeron::ClientConductor::closeAllResources(ClientConductor *this,longlong now)

{
  int iVar1;
  pointer pPVar2;
  element_type *peVar3;
  pointer pEVar4;
  element_type *peVar5;
  pointer pSVar6;
  Subscription *this_00;
  int iVar7;
  ImageList *imageList;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  pointer pPVar9;
  pointer pEVar10;
  pointer pSVar11;
  pointer this_01;
  bool bVar12;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_adminLock);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  (this->m_isClosed)._M_base._M_i = true;
  pPVar9 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_publications).
           super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pPVar9 == pPVar2) {
      std::
      vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
      ::_M_erase_at_end(&this->m_publications,
                        (this->m_publications).
                        super__Vector_base<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      pEVar10 = (this->m_exclusivePublications).
                super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar4 = (this->m_exclusivePublications).
               super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pEVar10 == pEVar4) {
          std::
          vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
          ::_M_erase_at_end(&this->m_exclusivePublications,
                            (this->m_exclusivePublications).
                            super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          pSVar11 = (this->m_subscriptions).
                    super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar6 = (this->m_subscriptions).
                   super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (pSVar11 == pSVar6) {
              pSVar11 = (this->m_subscriptions).
                        super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar6 = (this->m_subscriptions).
                       super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              this_01 = pSVar11;
              if (pSVar6 != pSVar11) {
                do {
                  SubscriptionStateDefn::~SubscriptionStateDefn(this_01);
                  this_01 = this_01 + 1;
                } while (this_01 != pSVar6);
                (this->m_subscriptions).
                super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
                ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
              }
              pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
              return;
            }
            p_Var8 = (pSVar11->m_subscription).
                     super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              iVar7 = p_Var8->_M_use_count;
              do {
                if (iVar7 == 0) {
                  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  break;
                }
                LOCK();
                iVar1 = p_Var8->_M_use_count;
                bVar12 = iVar7 == iVar1;
                if (bVar12) {
                  p_Var8->_M_use_count = iVar7 + 1;
                  iVar1 = iVar7;
                }
                iVar7 = iVar1;
                UNLOCK();
              } while (!bVar12);
            }
            if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar12 = true;
            }
            else {
              bVar12 = p_Var8->_M_use_count == 0;
            }
            if ((!bVar12) &&
               (this_00 = (pSVar11->m_subscription).
                          super___weak_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               this_00 != (Subscription *)0x0)) {
              imageList = Subscription::removeAndCloseAllImages(this_00);
              lingerAllResources(this,now,imageList);
            }
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            pSVar11 = pSVar11 + 1;
          } while( true );
        }
        p_Var8 = (pEVar10->m_publication).
                 super___weak_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar7 = p_Var8->_M_use_count;
          do {
            if (iVar7 == 0) {
              p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = p_Var8->_M_use_count;
            bVar12 = iVar7 == iVar1;
            if (bVar12) {
              p_Var8->_M_use_count = iVar7 + 1;
              iVar1 = iVar7;
            }
            iVar7 = iVar1;
            UNLOCK();
          } while (!bVar12);
        }
        if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar12 = true;
        }
        else {
          bVar12 = p_Var8->_M_use_count == 0;
        }
        if ((!bVar12) &&
           (peVar5 = (pEVar10->m_publication).
                     super___weak_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr, peVar5 != (element_type *)0x0)) {
          (peVar5->m_isClosed)._M_base._M_i = true;
        }
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
        pEVar10 = pEVar10 + 1;
      } while( true );
    }
    p_Var8 = (pPVar9->m_publication).
             super___weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = p_Var8->_M_use_count;
      do {
        if (iVar7 == 0) {
          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar1 = p_Var8->_M_use_count;
        bVar12 = iVar7 == iVar1;
        if (bVar12) {
          p_Var8->_M_use_count = iVar7 + 1;
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        UNLOCK();
      } while (!bVar12);
    }
    if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar12 = true;
    }
    else {
      bVar12 = p_Var8->_M_use_count == 0;
    }
    if ((!bVar12) &&
       (peVar3 = (pPVar9->m_publication).
                 super___weak_ptr<aeron::Publication,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       peVar3 != (element_type *)0x0)) {
      (peVar3->m_isClosed)._M_base._M_i = true;
    }
    if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
    }
    pPVar9 = pPVar9 + 1;
  } while( true );
}

Assistant:

void ClientConductor::closeAllResources(long long now)
{
    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    forceClose();

    std::for_each(m_publications.begin(), m_publications.end(),
        [&](PublicationStateDefn& entry)
        {
            std::shared_ptr<Publication> pub = entry.m_publication.lock();

            if (nullptr != pub)
            {
                pub->close();
            }
        });

    m_publications.clear();

    std::for_each(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [&](ExclusivePublicationStateDefn& entry)
        {
            std::shared_ptr<ExclusivePublication> pub = entry.m_publication.lock();

            if (nullptr != pub)
            {
                pub->close();
            }
        });

    m_exclusivePublications.clear();

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&](SubscriptionStateDefn& entry)
        {
            std::shared_ptr<Subscription> sub = entry.m_subscription.lock();

            if (nullptr != sub)
            {
                lingerAllResources(now, sub->removeAndCloseAllImages());
            }
        });

    m_subscriptions.clear();
}